

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O2

pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::insert(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *this,value_type entry)

{
  pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> pVar1;
  anon_union_16_2_67f50693_for_value local_28;
  unsigned_long local_18;
  
  if ((uint)entry.first.value._0_4_ < 0xd) {
    pVar1 = ::std::
            _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<duckdb::string_t_const,unsigned_long>>
                      ((_Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
                        *)&this->map,&entry);
  }
  else {
    local_28.pointer = (anon_struct_16_3_d7536bce_for_pointer)CopyString(this,entry.first.value);
    local_18 = entry.second;
    pVar1 = ::std::
            _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
            ::_M_emplace_unique<std::pair<duckdb::string_t,unsigned_long>>
                      ((_Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
                        *)&this->map,(pair<duckdb::string_t,_unsigned_long> *)&local_28.pointer);
  }
  return pVar1;
}

Assistant:

pair<iterator, bool> insert(value_type entry) { // NOLINT: match std style
		if (entry.first.IsInlined()) {
			return map.insert(std::move(entry));
		} else {
			return map.insert(make_pair(CopyString(entry.first), std::move(entry.second)));
		}
	}